

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::SetWriteThroughSymbolsSetForRegion
          (BackwardPass *this,BasicBlock *catchOrFinallyBlock,Region *tryRegion)

{
  Type TVar1;
  Type pJVar2;
  Region *pRVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BVSparse<Memory::JitArenaAllocator> *pBVar7;
  undefined4 *puVar8;
  BVSparse<Memory::JitArenaAllocator> *pBVar9;
  Type_conflict pBVar10;
  ulong uVar11;
  ulong uVar12;
  
  pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,this->func->m_alloc,0x3eba5c);
  pJVar2 = this->func->m_alloc;
  pBVar7->head = (Type_conflict)0x0;
  pBVar7->lastFoundIndex = (Type_conflict)0x0;
  pBVar7->alloc = pJVar2;
  pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
  tryRegion->writeThroughSymbolsSet = pBVar7;
  bVar5 = DoByteCodeUpwardExposedUsed(this);
  if (bVar5) {
    pBVar7 = catchOrFinallyBlock->byteCodeUpwardExposedUsed;
    pBVar9 = pBVar7;
    if (pBVar7 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x228b,"(catchOrFinallyBlock->byteCodeUpwardExposedUsed)",
                         "catchOrFinallyBlock->byteCodeUpwardExposedUsed");
      if (!bVar5) goto LAB_003e5184;
      *puVar8 = 0;
      pBVar7 = catchOrFinallyBlock->byteCodeUpwardExposedUsed;
      pBVar9 = pBVar7;
    }
    do {
      pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)pBVar7->head;
      if (pBVar7 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003e5056;
    } while (((Type *)&pBVar7->alloc)->word == 0);
    while (pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)pBVar9->head,
          pBVar9 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      uVar11 = ((Type *)&pBVar9->alloc)->word;
      if (uVar11 != 0) {
        TVar1 = *(Type *)&pBVar9->lastFoundIndex;
        uVar12 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar12);
          uVar11 = uVar11 & ~(1L << (uVar12 & 0x3f));
          BVSparse<Memory::JitArenaAllocator>::Set
                    (tryRegion->writeThroughSymbolsSet,(BVIndex)uVar12 + TVar1);
          uVar12 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
        } while (uVar11 != 0);
      }
    }
LAB_003e5056:
    pRVar3 = tryRegion->parent;
    if (pRVar3->type == RegionTypeTry) {
      pBVar7 = pRVar3->writeThroughSymbolsSet;
      if (pBVar7 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x22a8,"(parentTry->writeThroughSymbolsSet)",
                           "parentTry->writeThroughSymbolsSet");
        if (!bVar5) {
LAB_003e5184:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
        pBVar7 = pRVar3->writeThroughSymbolsSet;
      }
      pBVar10 = pBVar7->head;
      if (pBVar10 != (Type_conflict)0x0) {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          uVar11 = (pBVar10->data).word;
          if (uVar11 != 0) {
            TVar1 = pBVar10->startIndex;
            uVar12 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            do {
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar12);
              BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                (tryRegion->writeThroughSymbolsSet,TVar1 + (BVIndex)uVar12);
              if (BVar6 == '\0') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar8 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x22ab,"(tryRegion->writeThroughSymbolsSet->Test(id))",
                                   "tryRegion->writeThroughSymbolsSet->Test(id)");
                if (!bVar5) goto LAB_003e5184;
                *puVar8 = 0;
              }
              uVar11 = uVar11 & ~(1L << (uVar12 & 0x3f));
              uVar12 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
            } while (uVar11 != 0);
          }
          pBVar10 = pBVar10->next;
        } while (pBVar10 != (Type)0x0);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::SetWriteThroughSymbolsSetForRegion(BasicBlock * catchOrFinallyBlock, Region * tryRegion)
{
    tryRegion->writeThroughSymbolsSet = JitAnew(this->func->m_alloc, BVSparse<JitArenaAllocator>, this->func->m_alloc);

    if (this->DoByteCodeUpwardExposedUsed())
    {
        Assert(catchOrFinallyBlock->byteCodeUpwardExposedUsed);
        if (!catchOrFinallyBlock->byteCodeUpwardExposedUsed->IsEmpty())
        {
            FOREACH_BITSET_IN_SPARSEBV(id, catchOrFinallyBlock->byteCodeUpwardExposedUsed)
            {
                tryRegion->writeThroughSymbolsSet->Set(id);
            }
            NEXT_BITSET_IN_SPARSEBV
        }
#if DBG
        // Symbols write-through in the parent try region should be marked as write-through in the current try region as well.
        // x =
        // try{
        //      try{
        //          x =         <-- x needs to be write-through here. With the current mechanism of not clearing a write-through
        //                          symbol from the bytecode upward-exposed on a def, x should be marked as write-through as
        //                          write-through symbols for a try are basically the bytecode upward exposed symbols at the
        //                          beginning of the corresponding catch block).
        //                          Verify that it still holds.
        //          <exception>
        //      }
        //      catch(){}
        //      x =
        // }
        // catch(){}
        // = x
        if (tryRegion->GetParent()->GetType() == RegionTypeTry)
        {
            Region * parentTry = tryRegion->GetParent();
            Assert(parentTry->writeThroughSymbolsSet);
            FOREACH_BITSET_IN_SPARSEBV(id, parentTry->writeThroughSymbolsSet)
            {
                Assert(tryRegion->writeThroughSymbolsSet->Test(id));
            }
            NEXT_BITSET_IN_SPARSEBV
        }
#endif
    }
    else
    {
        // this can happen with -off:globopt
        return;
    }
}